

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t format_small_keypad_key
                  (char *buf,Terminal *term,SmallKeypadKey key,_Bool shift,_Bool ctrl,_Bool alt,
                  _Bool *consumed_alt)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  char *__format;
  wchar_t local_30;
  uint local_2c;
  wchar_t bitmap;
  wchar_t code;
  char *p;
  _Bool alt_local;
  _Bool ctrl_local;
  _Bool shift_local;
  SmallKeypadKey key_local;
  Terminal *term_local;
  char *buf_local;
  
  puVar3 = &switchD_00116c37::switchdataD_00135d24;
  switch(key) {
  case SKK_HOME:
    local_2c = 1;
    break;
  case SKK_END:
    local_2c = 4;
    break;
  case SKK_INSERT:
    local_2c = 2;
    break;
  case SKK_DELETE:
    local_2c = 3;
    break;
  case SKK_PGUP:
    local_2c = 5;
    break;
  case SKK_PGDN:
    local_2c = 6;
    break;
  default:
    __assert_fail("false && \"bad small keypad key enum value\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1d46,
                  "int format_small_keypad_key(char *, Terminal *, SmallKeypadKey, _Bool, _Bool, _Bool, _Bool *)"
                 );
  }
  if ((term->funky_type == L'\x03') && (local_2c < 7)) {
    puVar3 = (uint *)(long)(int)local_2c;
    local_2c = (uint)""[(long)puVar3];
  }
  iVar1 = (int)buf;
  if ((((term->vt52_mode & 1U) == 0) || ((int)local_2c < 1)) || (6 < (int)local_2c)) {
    if (term->funky_type == L'\x05') {
      if (local_2c == 3) {
        bitmap = iVar1 + L'\x01';
        *buf = '\x7f';
      }
      else {
        iVar2 = sprintf(buf,"\x1b[%c",(ulong)(uint)(int)"HL.FIG"[(int)(local_2c - 1)],
                        (long)(int)(local_2c - 1),buf,consumed_alt);
        bitmap = iVar1 + iVar2;
      }
    }
    else {
      if (((local_2c == 1) || (local_2c == 4)) && ((term->rxvt_homeend & 1U) != 0)) {
        __format = "\x1bOw";
        if (local_2c == 1) {
          __format = "\x1b[H";
        }
        iVar2 = sprintf(buf,__format);
      }
      else if ((term->vt52_mode & 1U) == 0) {
        local_30 = L'\0';
        if (term->funky_type == L'\x06') {
          local_30 = shift_bitmap(shift,ctrl,alt,consumed_alt);
        }
        if (local_30 == L'\0') {
          iVar2 = sprintf(buf,"\x1b[%d~",(ulong)local_2c);
        }
        else {
          iVar2 = sprintf(buf,"\x1b[%d;%d~",(ulong)local_2c,(ulong)(uint)local_30);
        }
      }
      else {
        iVar2 = sprintf(buf,"\x1b[%d~",(ulong)local_2c,puVar3,buf,consumed_alt);
      }
      bitmap = iVar1 + iVar2;
    }
  }
  else {
    iVar2 = sprintf(buf,"\x1b%c",(ulong)(uint)(int)" HLMEIG"[(int)local_2c],(long)(int)local_2c,buf,
                    consumed_alt);
    bitmap = iVar1 + iVar2;
  }
  return bitmap - iVar1;
}

Assistant:

int format_small_keypad_key(char *buf, Terminal *term, SmallKeypadKey key,
                            bool shift, bool ctrl, bool alt,
                            bool *consumed_alt)
{
    char *p = buf;

    int code;
    switch (key) {
      case SKK_HOME: code = 1; break;
      case SKK_INSERT: code = 2; break;
      case SKK_DELETE: code = 3; break;
      case SKK_END: code = 4; break;
      case SKK_PGUP: code = 5; break;
      case SKK_PGDN: code = 6; break;
      default: unreachable("bad small keypad key enum value");
    }

    /* Reorder edit keys to physical order */
    if (term->funky_type == FUNKY_VT400 && code <= 6)
        code = "\0\2\1\4\5\3\6"[code];

    if (term->vt52_mode && code > 0 && code <= 6) {
        p += sprintf(p, "\x1B%c", " HLMEIG"[code]);
    } else if (term->funky_type == FUNKY_SCO) {
        static const char codes[] = "HL.FIG";
        if (code == 3) {
            *p++ = '\x7F';
        } else {
            p += sprintf(p, "\x1B[%c", codes[code-1]);
        }
    } else if ((code == 1 || code == 4) && term->rxvt_homeend) {
        p += sprintf(p, code == 1 ? "\x1B[H" : "\x1BOw");
    } else {
        if (term->vt52_mode) {
	    p += sprintf(p, "\x1B[%d~", code);
        } else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
            else
                p += sprintf(p, "\x1B[%d~", code);
        }
    }

    return p - buf;
}